

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O3

UniValue * AddrmanEntryToJSON(UniValue *__return_storage_ptr__,AddrInfo *info,CConnman *connman)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string key;
  string key_00;
  string key_01;
  string key_02;
  string key_03;
  string key_04;
  string key_05;
  string key_06;
  string key_07;
  UniValue val;
  UniValue val_00;
  UniValue val_01;
  UniValue val_02;
  UniValue val_03;
  UniValue val_04;
  UniValue val_05;
  UniValue val_06;
  UniValue val_07;
  uint16_t uVar2;
  uint32_t uVar3;
  Network NVar4;
  uint32_t uVar5;
  CNetAddr *this;
  long in_FS_OFFSET;
  uint32_t mapped_as;
  uint32_t source_mapped_as;
  undefined4 in_stack_fffffffffffffb48;
  uint in_stack_fffffffffffffb4c;
  undefined8 in_stack_fffffffffffffb50;
  _Alloc_hider in_stack_fffffffffffffb58;
  size_type in_stack_fffffffffffffb60;
  undefined8 in_stack_fffffffffffffb68;
  undefined1 auVar6 [32];
  undefined1 in_stack_fffffffffffffb70 [56];
  undefined8 in_stack_fffffffffffffba8;
  undefined1 *puVar7;
  undefined8 in_stack_fffffffffffffbb0;
  pointer in_stack_fffffffffffffbb8;
  UniValue local_438;
  long *local_3e0 [2];
  long local_3d0 [2];
  UniValue local_3c0;
  long *local_368 [2];
  long local_358 [2];
  UniValue local_348;
  long *local_2f0 [2];
  long local_2e0 [2];
  UniValue local_2d0;
  long *local_278 [2];
  long local_268 [2];
  UniValue local_258;
  long *local_200 [2];
  long local_1f0 [2];
  UniValue local_1e0;
  long *local_188 [2];
  long local_178 [2];
  UniValue local_168;
  long *local_110 [2];
  long local_100 [2];
  string local_f0;
  UniValue local_d0;
  long *local_78 [2];
  long local_68 [2];
  undefined1 *local_58;
  undefined8 local_50;
  undefined1 local_48;
  undefined8 local_47;
  undefined4 local_3f;
  undefined2 local_3b;
  char local_39;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = &local_48;
  __return_storage_ptr__->typ = VOBJ;
  (__return_storage_ptr__->val)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->val).field_2;
  (__return_storage_ptr__->val).field_2._M_local_buf[0] = '\0';
  *(undefined8 *)((long)&(__return_storage_ptr__->val).field_2 + 1) = local_47;
  *(undefined4 *)((long)&(__return_storage_ptr__->val).field_2 + 9) = local_3f;
  *(undefined2 *)((long)&(__return_storage_ptr__->val).field_2 + 0xd) = local_3b;
  (__return_storage_ptr__->val).field_2._M_local_buf[0xf] = local_39;
  (__return_storage_ptr__->val)._M_string_length = 0;
  local_50 = 0;
  local_48 = 0;
  (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->keys).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->keys).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->keys).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"address","");
  CNetAddr::ToStringAddr_abi_cxx11_(&local_f0,(CNetAddr *)info);
  UniValue::
  UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_d0,&local_f0);
  key._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffb4c;
  key._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffb48;
  key._M_string_length = in_stack_fffffffffffffb50;
  key.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffb58._M_p;
  key.field_2._8_8_ = in_stack_fffffffffffffb60;
  auVar6 = in_stack_fffffffffffffb70._0_32_;
  val.val._M_dataplus._M_p = (pointer)auVar6._0_8_;
  val.val._M_string_length = auVar6._8_8_;
  val.val.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )auVar6._16_16_;
  val.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data =
       (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )in_stack_fffffffffffffb70._32_24_;
  val._0_8_ = in_stack_fffffffffffffb68;
  val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_fffffffffffffba8;
  val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_fffffffffffffbb0;
  val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffffbb8;
  UniValue::pushKV(__return_storage_ptr__,key,val);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_d0.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_d0.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.val._M_dataplus._M_p != &local_d0.val.field_2) {
    operator_delete(local_d0.val._M_dataplus._M_p,local_d0.val.field_2._M_allocated_capacity + 1);
  }
  paVar1 = &local_f0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  uVar3 = CConnman::GetMappedAS(connman,(CNetAddr *)info);
  if (uVar3 != 0) {
    local_110[0] = local_100;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"mapped_as","");
    UniValue::UniValue<const_unsigned_int_&,_unsigned_int,_true>
              (&local_168,(uint *)&stack0xfffffffffffffb4c);
    key_00._M_dataplus._M_p._4_4_ = uVar3;
    key_00._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffb48;
    key_00._M_string_length = in_stack_fffffffffffffb50;
    key_00.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffb58._M_p;
    key_00.field_2._8_8_ = in_stack_fffffffffffffb60;
    auVar6 = in_stack_fffffffffffffb70._0_32_;
    val_00.val._M_dataplus._M_p = (pointer)auVar6._0_8_;
    val_00.val._M_string_length = auVar6._8_8_;
    val_00.val.field_2 =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          )auVar6._16_16_;
    val_00.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data =
         (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )in_stack_fffffffffffffb70._32_24_;
    val_00._0_8_ = in_stack_fffffffffffffb68;
    val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffba8;
    val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffbb0;
    val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffffbb8;
    UniValue::pushKV(__return_storage_ptr__,key_00,val_00);
    std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_168.values);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_168.keys);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168.val._M_dataplus._M_p != &local_168.val.field_2) {
      operator_delete(local_168.val._M_dataplus._M_p,local_168.val.field_2._M_allocated_capacity + 1
                     );
    }
    if (local_110[0] != local_100) {
      operator_delete(local_110[0],local_100[0] + 1);
    }
  }
  local_188[0] = local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"port","");
  uVar2 = CService::GetPort((CService *)info);
  local_f0._M_dataplus._M_p._0_2_ = uVar2;
  UniValue::UniValue<unsigned_short,_unsigned_short,_true>(&local_1e0,(unsigned_short *)&local_f0);
  key_01._M_dataplus._M_p._4_4_ = uVar3;
  key_01._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffb48;
  key_01._M_string_length = in_stack_fffffffffffffb50;
  key_01.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffb58._M_p;
  key_01.field_2._8_8_ = in_stack_fffffffffffffb60;
  auVar6 = in_stack_fffffffffffffb70._0_32_;
  val_01.val._M_dataplus._M_p = (pointer)auVar6._0_8_;
  val_01.val._M_string_length = auVar6._8_8_;
  val_01.val.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )auVar6._16_16_;
  val_01.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data =
       (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )in_stack_fffffffffffffb70._32_24_;
  val_01._0_8_ = in_stack_fffffffffffffb68;
  val_01.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffba8;
  val_01.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffbb0;
  val_01.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffffbb8;
  UniValue::pushKV(__return_storage_ptr__,key_01,val_01);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_1e0.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1e0.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0.val._M_dataplus._M_p != &local_1e0.val.field_2) {
    operator_delete(local_1e0.val._M_dataplus._M_p,local_1e0.val.field_2._M_allocated_capacity + 1);
  }
  if (local_188[0] != local_178) {
    operator_delete(local_188[0],local_178[0] + 1);
  }
  local_200[0] = local_1f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"services","");
  local_f0._M_dataplus._M_p = (pointer)(info->super_CAddress).nServices;
  UniValue::UniValue<unsigned_long,_unsigned_long,_true>(&local_258,(unsigned_long *)&local_f0);
  key_02._M_dataplus._M_p._4_4_ = uVar3;
  key_02._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffb48;
  key_02._M_string_length = in_stack_fffffffffffffb50;
  key_02.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffb58._M_p;
  key_02.field_2._8_8_ = in_stack_fffffffffffffb60;
  auVar6 = in_stack_fffffffffffffb70._0_32_;
  val_02.val._M_dataplus._M_p = (pointer)auVar6._0_8_;
  val_02.val._M_string_length = auVar6._8_8_;
  val_02.val.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )auVar6._16_16_;
  val_02.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data =
       (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )in_stack_fffffffffffffb70._32_24_;
  val_02._0_8_ = in_stack_fffffffffffffb68;
  val_02.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffba8;
  val_02.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffbb0;
  val_02.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffffbb8;
  UniValue::pushKV(__return_storage_ptr__,key_02,val_02);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_258.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_258.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258.val._M_dataplus._M_p != &local_258.val.field_2) {
    operator_delete(local_258.val._M_dataplus._M_p,local_258.val.field_2._M_allocated_capacity + 1);
  }
  if (local_200[0] != local_1f0) {
    operator_delete(local_200[0],local_1f0[0] + 1);
  }
  local_278[0] = local_268;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"time","");
  local_f0._M_dataplus._M_p = (pointer)(info->super_CAddress).nTime.__d.__r;
  UniValue::UniValue<long,_long,_true>(&local_2d0,(long *)&local_f0);
  key_03._M_dataplus._M_p._4_4_ = uVar3;
  key_03._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffb48;
  key_03._M_string_length = in_stack_fffffffffffffb50;
  key_03.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffb58._M_p;
  key_03.field_2._8_8_ = in_stack_fffffffffffffb60;
  auVar6 = in_stack_fffffffffffffb70._0_32_;
  val_03.val._M_dataplus._M_p = (pointer)auVar6._0_8_;
  val_03.val._M_string_length = auVar6._8_8_;
  val_03.val.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )auVar6._16_16_;
  val_03.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data =
       (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )in_stack_fffffffffffffb70._32_24_;
  val_03._0_8_ = in_stack_fffffffffffffb68;
  val_03.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffba8;
  val_03.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffbb0;
  val_03.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffffbb8;
  UniValue::pushKV(__return_storage_ptr__,key_03,val_03);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_2d0.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2d0.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0.val._M_dataplus._M_p != &local_2d0.val.field_2) {
    operator_delete(local_2d0.val._M_dataplus._M_p,local_2d0.val.field_2._M_allocated_capacity + 1);
  }
  if (local_278[0] != local_268) {
    operator_delete(local_278[0],local_268[0] + 1);
  }
  local_2f0[0] = local_2e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2f0,"network","");
  NVar4 = CNetAddr::GetNetClass((CNetAddr *)info);
  GetNetworkName_abi_cxx11_(&local_f0,NVar4);
  UniValue::
  UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_348,&local_f0);
  key_04._M_dataplus._M_p._4_4_ = uVar3;
  key_04._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffb48;
  key_04._M_string_length = in_stack_fffffffffffffb50;
  key_04.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffb58._M_p;
  key_04.field_2._8_8_ = in_stack_fffffffffffffb60;
  auVar6 = in_stack_fffffffffffffb70._0_32_;
  val_04.val._M_dataplus._M_p = (pointer)auVar6._0_8_;
  val_04.val._M_string_length = auVar6._8_8_;
  val_04.val.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )auVar6._16_16_;
  val_04.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data =
       (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )in_stack_fffffffffffffb70._32_24_;
  val_04._0_8_ = in_stack_fffffffffffffb68;
  val_04.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffba8;
  val_04.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffbb0;
  val_04.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffffbb8;
  UniValue::pushKV(__return_storage_ptr__,key_04,val_04);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_348.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_348.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348.val._M_dataplus._M_p != &local_348.val.field_2) {
    operator_delete(local_348.val._M_dataplus._M_p,local_348.val.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if (local_2f0[0] != local_2e0) {
    operator_delete(local_2f0[0],local_2e0[0] + 1);
  }
  local_368[0] = local_358;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_368,"source","");
  this = &info->source;
  CNetAddr::ToStringAddr_abi_cxx11_(&local_f0,this);
  UniValue::
  UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_3c0,&local_f0);
  key_05._M_dataplus._M_p._4_4_ = uVar3;
  key_05._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffb48;
  key_05._M_string_length = in_stack_fffffffffffffb50;
  key_05.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffb58._M_p;
  key_05.field_2._8_8_ = in_stack_fffffffffffffb60;
  auVar6 = in_stack_fffffffffffffb70._0_32_;
  val_05.val._M_dataplus._M_p = (pointer)auVar6._0_8_;
  val_05.val._M_string_length = auVar6._8_8_;
  val_05.val.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )auVar6._16_16_;
  val_05.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data =
       (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )in_stack_fffffffffffffb70._32_24_;
  val_05._0_8_ = in_stack_fffffffffffffb68;
  val_05.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffba8;
  val_05.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffbb0;
  val_05.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffffbb8;
  UniValue::pushKV(__return_storage_ptr__,key_05,val_05);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_3c0.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_3c0.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0.val._M_dataplus._M_p != &local_3c0.val.field_2) {
    operator_delete(local_3c0.val._M_dataplus._M_p,local_3c0.val.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if (local_368[0] != local_358) {
    operator_delete(local_368[0],local_358[0] + 1);
  }
  local_3e0[0] = local_3d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3e0,"source_network","");
  NVar4 = CNetAddr::GetNetClass(this);
  GetNetworkName_abi_cxx11_(&local_f0,NVar4);
  UniValue::
  UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_438,&local_f0);
  key_06._M_dataplus._M_p._4_4_ = uVar3;
  key_06._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffb48;
  key_06._M_string_length = in_stack_fffffffffffffb50;
  key_06.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffb58._M_p;
  key_06.field_2._8_8_ = in_stack_fffffffffffffb60;
  auVar6 = in_stack_fffffffffffffb70._0_32_;
  val_06.val._M_dataplus._M_p = (pointer)auVar6._0_8_;
  val_06.val._M_string_length = auVar6._8_8_;
  val_06.val.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )auVar6._16_16_;
  val_06.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data =
       (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )in_stack_fffffffffffffb70._32_24_;
  val_06._0_8_ = in_stack_fffffffffffffb68;
  val_06.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffba8;
  val_06.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffbb0;
  val_06.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffffbb8;
  UniValue::pushKV(__return_storage_ptr__,key_06,val_06);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_438.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_438.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438.val._M_dataplus._M_p != &local_438.val.field_2) {
    operator_delete(local_438.val._M_dataplus._M_p,local_438.val.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if (local_3e0[0] != local_3d0) {
    operator_delete(local_3e0[0],local_3d0[0] + 1);
  }
  uVar5 = CConnman::GetMappedAS(connman,this);
  local_f0._M_dataplus._M_p._0_4_ = uVar5;
  if (uVar5 != 0) {
    puVar7 = &stack0xfffffffffffffbb8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&stack0xfffffffffffffba8,"source_mapped_as","");
    UniValue::UniValue<const_unsigned_int_&,_unsigned_int,_true>
              ((UniValue *)&stack0xfffffffffffffb50,(uint *)&local_f0);
    key_07._M_dataplus._M_p._4_4_ = uVar3;
    key_07._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffb48;
    key_07._M_string_length = in_stack_fffffffffffffb50;
    key_07.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffb58._M_p;
    key_07.field_2._8_8_ = in_stack_fffffffffffffb60;
    auVar6 = in_stack_fffffffffffffb70._0_32_;
    val_07.val._M_dataplus._M_p = (pointer)auVar6._0_8_;
    val_07.val._M_string_length = auVar6._8_8_;
    val_07.val.field_2 =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          )auVar6._16_16_;
    val_07.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data =
         (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )in_stack_fffffffffffffb70._32_24_;
    val_07._0_8_ = in_stack_fffffffffffffb68;
    val_07.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)puVar7;
    val_07.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffbb0;
    val_07.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffffbb8;
    UniValue::pushKV(__return_storage_ptr__,key_07,val_07);
    std::vector<UniValue,_std::allocator<UniValue>_>::~vector
              ((vector<UniValue,_std::allocator<UniValue>_> *)&stack0xfffffffffffffb90);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&stack0xfffffffffffffb78);
    if (in_stack_fffffffffffffb58._M_p != &stack0xfffffffffffffb68) {
      operator_delete(in_stack_fffffffffffffb58._M_p,in_stack_fffffffffffffb68 + 1);
    }
    if (puVar7 != &stack0xfffffffffffffbb8) {
      operator_delete(puVar7,(ulong)((long)&in_stack_fffffffffffffbb8->typ + 1));
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

UniValue AddrmanEntryToJSON(const AddrInfo& info, CConnman& connman)
{
    UniValue ret(UniValue::VOBJ);
    ret.pushKV("address", info.ToStringAddr());
    const auto mapped_as{connman.GetMappedAS(info)};
    if (mapped_as != 0) {
        ret.pushKV("mapped_as", mapped_as);
    }
    ret.pushKV("port", info.GetPort());
    ret.pushKV("services", (uint64_t)info.nServices);
    ret.pushKV("time", int64_t{TicksSinceEpoch<std::chrono::seconds>(info.nTime)});
    ret.pushKV("network", GetNetworkName(info.GetNetClass()));
    ret.pushKV("source", info.source.ToStringAddr());
    ret.pushKV("source_network", GetNetworkName(info.source.GetNetClass()));
    const auto source_mapped_as{connman.GetMappedAS(info.source)};
    if (source_mapped_as != 0) {
        ret.pushKV("source_mapped_as", source_mapped_as);
    }
    return ret;
}